

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O0

bool __thiscall xray_re::_vector3<float>::similar(_vector3<float> *this,_vector3<float> *v,float e)

{
  int __x;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float e_local;
  _vector3<float> *v_local;
  _vector3<float> *this_local;
  
  __x = (int)this;
  std::abs(__x);
  if (extraout_XMM0_Da < e) {
    std::abs(__x);
    if (extraout_XMM0_Da_00 < e) {
      std::abs(__x);
      if (extraout_XMM0_Da_01 < e) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool _vector3<T>::similar(const _vector3<T>& v, T e) const
{
	if (e <= std::abs(v.x - x))
		return false;
	if (e <= std::abs(v.y - y))
		return false;
	if (e <= std::abs(v.z - z))
		return false;
	return true;
}